

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_filename.c
# Opt level: O3

void test_read_format_cpio_filename_CP866_KOI8R(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_conflict *a;
  la_int64_t lVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  pcVar3 = setlocale(6,"Russian_Russia.20866");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = setlocale(6,"ru_RU.KOI8-R");
    if (pcVar3 == (char *)0x0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'É');
      test_skipping("ru_RU.KOI8-R locale not available on this system.");
      return;
    }
  }
  extract_reference_file("test_read_format_cpio_filename_cp866.cpio");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'Î',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                      ,L'Ï',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                      ,L'Ð',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  iVar1 = archive_read_set_options((archive *)a,"hdrcharset=CP866");
  if (iVar1 == 0) {
    wVar2 = archive_read_open_filename(a,"test_read_format_cpio_filename_cp866.cpio",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'×',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'Ü',anon_var_dwarf_6f261,"\"\\xf0\\xf2\\xe9\\xf7\\xe5\\xf4\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ý',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'à',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'â',anon_var_dwarf_6f27f,"\"\\xd0\\xd2\\xc9\\xd7\\xc5\\xd4\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ã',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ç',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ê',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
    iVar1 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ë',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)",a
                       );
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'î',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'Ò');
    test_skipping("This system cannot convert character-set from CP866 to KOI8-R.");
  }
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                      ,L'ð',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_filename_CP866_KOI8R)
{
	const char *refname = "test_read_format_cpio_filename_cp866.cpio";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read CP866 filename in ru_RU.KOI8-R with "hdrcharset=CP866" option.
	 */
	if (NULL == setlocale(LC_ALL, "Russian_Russia.20866") &&
	    NULL == setlocale(LC_ALL, "ru_RU.KOI8-R")) {
		skipping("ru_RU.KOI8-R locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=CP866")) {
		skipping("This system cannot convert character-set"
		    " from CP866 to KOI8-R.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xf0\xf2\xe9\xf7\xe5\xf4",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xd0\xd2\xc9\xd7\xc5\xd4",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_CPIO_POSIX, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}